

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<FSoundID,_FSoundID>::DoCopy
          (TArray<FSoundID,_FSoundID> *this,TArray<FSoundID,_FSoundID> *other)

{
  uint uVar1;
  FSoundID *pFVar2;
  uint local_1c;
  uint i;
  TArray<FSoundID,_FSoundID> *other_local;
  TArray<FSoundID,_FSoundID> *this_local;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if (this->Count == 0) {
    this->Array = (FSoundID *)0x0;
  }
  else {
    pFVar2 = (FSoundID *)
             M_Malloc_Dbg((ulong)this->Most << 2,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                          ,0x19e);
    this->Array = pFVar2;
    for (local_1c = 0; local_1c < this->Count; local_1c = local_1c + 1) {
      FSoundID::FSoundID(this->Array + local_1c,other->Array + local_1c);
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}